

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::convert_to_f32
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr,uint32_t components)

{
  char (*in_R9) [2];
  string local_1a8;
  undefined1 local_188 [8];
  SPIRType t;
  uint32_t components_local;
  string *expr_local;
  CompilerMSL *this_local;
  
  t.member_name_cache._M_h._M_single_bucket._4_4_ = components;
  SPIRType::SPIRType((SPIRType *)local_188,OpTypeVector - (components < 2));
  t.super_IVariant.self.id = 0xd;
  t.basetype = t.member_name_cache._M_h._M_single_bucket._4_4_;
  t.width = 1;
  CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
            (&local_1a8,&this->super_CompilerGLSL,(SPIRType *)local_188);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&local_1a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ac375,
             (char (*) [2])expr,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,in_R9);
  ::std::__cxx11::string::~string((string *)&local_1a8);
  SPIRType::~SPIRType((SPIRType *)local_188);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_to_f32(const string &expr, uint32_t components)
{
	SPIRType t { components > 1 ? OpTypeVector : OpTypeFloat };
	t.basetype = SPIRType::Float;
	t.vecsize = components;
	t.columns = 1;
	return join(type_to_glsl_constructor(t), "(", expr, ")");
}